

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  uchar *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar12;
  ImGuiContext *pIVar13;
  uint uVar14;
  int num_vertices;
  int iVar15;
  ulong uVar16;
  stbtt_vertex *vertices;
  ushort *puVar17;
  stbtt_vertex *__dest;
  int iVar18;
  long lVar19;
  short sVar20;
  int cy;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 auVar25 [8];
  long lVar26;
  byte bVar27;
  byte bVar28;
  ushort uVar29;
  short sVar30;
  stbtt_vertex *psVar31;
  uint uVar32;
  ushort *puVar34;
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  int cx;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  stbtt_vertex *comp_verts;
  stbtt_vertex **local_40;
  uchar *local_38;
  ulong uVar24;
  ulong uVar33;
  
  puVar6 = info->data;
  uVar14 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  pIVar13 = GImGui;
  if ((int)uVar14 < 0) {
LAB_00163552:
    uVar14 = 0;
  }
  else {
    uVar16 = (ulong)uVar14;
    uVar5 = CONCAT11(puVar6[uVar16],puVar6[uVar16 + 1]);
    local_40 = pvertices;
    if ((short)uVar5 < 1) {
      if (uVar5 == 0xffff) {
        uVar22 = 0;
        vertices = (stbtt_vertex *)0x0;
        puVar17 = (ushort *)(puVar6 + uVar16 + 10);
        for (bVar28 = 1; uVar14 = (uint)uVar22, bVar28 != 0; bVar28 = bVar28 & 0x20) {
          comp_verts = (stbtt_vertex *)0x0;
          bVar28 = *(byte *)((long)puVar17 + 1);
          if ((bVar28 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                          ,0x586,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar28 & 1) == 0) {
            iVar18 = (int)(char)puVar17[2];
            iVar38 = (int)((long)((ulong)*(byte *)((long)puVar17 + 5) << 0x38) >> 0x38);
            lVar19 = 6;
          }
          else {
            auVar8._9_7_ = 0;
            auVar8._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar7._10_6_ = 0;
            auVar7._0_10_ = SUB1610(auVar8 << 0x38,6);
            auVar43._11_5_ = 0;
            auVar43._0_11_ = SUB1611(auVar7 << 0x30,5);
            auVar9._1_12_ = SUB1612(auVar43 << 0x28,4);
            auVar9[0] = (char)puVar17[3];
            auVar9._13_3_ = 0;
            auVar37._1_14_ = SUB1614(auVar9 << 0x18,2);
            auVar37[0] = (char)puVar17[2];
            auVar37[0xf] = 0;
            auVar37 = ZEXT416((uint)*(byte *)((long)puVar17 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar17 + 5)) | auVar37 << 8;
            iVar18 = (int)auVar37._0_2_;
            iVar38 = (int)auVar37._2_2_;
            lVar19 = 8;
          }
          puVar34 = (ushort *)(lVar19 + (long)puVar17);
          if ((bVar28 & 8) == 0) {
            if ((bVar28 & 0x40) != 0) {
              uVar5 = *puVar34;
              fVar40 = (float)(int)(short)(puVar34[1] << 8 | puVar34[1] >> 8) * 6.1035156e-05;
              puVar34 = puVar34 + 2;
              _local_68 = ZEXT416((uint)((float)(int)(short)(uVar5 << 8 | uVar5 >> 8) *
                                        6.1035156e-05));
              goto LAB_0016330f;
            }
            if ((char)bVar28 < '\0') {
              local_68._0_4_ =
                   (float)(int)CONCAT11((char)*puVar34,*(undefined1 *)((long)puVar34 + 1)) *
                   6.1035156e-05;
              local_68._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)puVar34[2],
                                                       *(undefined1 *)((long)puVar34 + 5)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              _fStack_60 = 0;
              local_78._0_4_ =
                   (float)(int)CONCAT11((char)puVar34[1],*(undefined1 *)((long)puVar34 + 3)) *
                   6.1035156e-05;
              local_78._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)puVar34[3],
                                                       *(undefined1 *)((long)puVar34 + 7)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              local_78._8_8_ = 0;
              puVar34 = puVar34 + 4;
            }
            else {
              _local_68 = ZEXT812(0x3f800000);
              fStack_5c = 0.0;
              local_78 = ZEXT816(0x3f80000000000000);
            }
          }
          else {
            fVar40 = (float)(int)(short)(*puVar34 << 8 | *puVar34 >> 8) * 6.1035156e-05;
            puVar34 = puVar34 + 1;
            register0x00001244 = SUB1612((undefined1  [16])0x0,4);
            local_68._0_4_ = fVar40;
LAB_0016330f:
            local_78 = ZEXT416((uint)fVar40) << 0x20;
          }
          uVar23 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8),
                                       &comp_verts);
          psVar31 = comp_verts;
          if (0 < (int)uVar23) {
            fVar40 = local_78._0_4_;
            fVar44 = local_78._4_4_;
            auVar36._0_4_ = fVar40 * fVar40;
            auVar36._4_4_ = fVar44 * fVar44;
            auVar36._8_4_ = local_78._8_4_ * local_78._8_4_;
            auVar36._12_4_ = local_78._12_4_ * local_78._12_4_;
            auVar39._0_4_ = (float)local_68._0_4_ * (float)local_68._0_4_ + auVar36._0_4_;
            auVar39._4_4_ = (float)local_68._4_4_ * (float)local_68._4_4_ + auVar36._4_4_;
            auVar39._8_4_ = fStack_60 * fStack_60 + auVar36._8_4_;
            auVar39._12_4_ = fStack_5c * fStack_5c + auVar36._12_4_;
            auVar37 = sqrtps(auVar36,auVar39);
            for (lVar19 = 0; pIVar13 = GImGui, (ulong)uVar23 * 10 - lVar19 != 0;
                lVar19 = lVar19 + 10) {
              fVar41 = (float)(int)*(short *)((long)&comp_verts->x + lVar19);
              fVar45 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cx + lVar19) <<
                                          0x30) >> 0x30);
              fVar46 = (float)(int)*(short *)((long)&comp_verts->y + lVar19);
              fVar47 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cy + lVar19) <<
                                          0x30) >> 0x30);
              auVar42._0_4_ =
                   (int)((fVar46 * (float)local_68._4_4_ + fVar41 * (float)local_68._0_4_ +
                         (float)iVar18) * auVar37._0_4_);
              auVar42._4_4_ =
                   (int)((fVar46 * fVar44 + fVar41 * fVar40 + (float)iVar38) * auVar37._4_4_);
              auVar42._8_4_ =
                   (int)((fVar47 * (float)local_68._4_4_ + fVar45 * (float)local_68._0_4_ +
                         (float)iVar18) * auVar37._0_4_);
              auVar42._12_4_ =
                   (int)((fVar47 * fVar44 + fVar45 * fVar40 + (float)iVar38) * auVar37._4_4_);
              auVar43 = packssdw(auVar42,auVar42);
              *(long *)((long)&comp_verts->x + lVar19) = auVar43._0_8_;
            }
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            __dest = (stbtt_vertex *)(*(pIVar13->IO).MemAllocFn)((ulong)(uVar23 + uVar14) * 10);
            pIVar13 = GImGui;
            if (__dest == (stbtt_vertex *)0x0) {
              if (vertices != (stbtt_vertex *)0x0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + -1;
                (*(pIVar13->IO).MemFreeFn)(vertices);
              }
              pIVar13 = GImGui;
              if (psVar31 != (stbtt_vertex *)0x0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + -1;
                (*(pIVar13->IO).MemFreeFn)(psVar31);
              }
              goto LAB_00163552;
            }
            if (0 < (int)uVar14) {
              memcpy(__dest,vertices,uVar22 * 10);
            }
            memcpy(__dest + uVar22,psVar31,(ulong)uVar23 * 10);
            pIVar13 = GImGui;
            if (vertices != (stbtt_vertex *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
              (*(pIVar13->IO).MemFreeFn)(vertices);
            }
            ImGui::MemFree(psVar31);
            vertices = __dest;
            uVar14 = uVar23 + uVar14;
          }
          uVar22 = (ulong)uVar14;
          puVar17 = puVar34;
        }
      }
      else {
        if ((short)((ushort)puVar6[uVar16] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                        ,0x5bb,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        uVar14 = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar22 = (ulong)((uint)uVar5 * 2);
      bVar28 = puVar6[uVar22 + uVar16 + 10];
      bVar27 = puVar6[uVar22 + uVar16 + 0xb];
      bVar2 = puVar6[uVar22 + uVar16 + 8];
      bVar3 = puVar6[uVar22 + uVar16 + 9];
      iVar18 = (uint)bVar2 * 0x100 + (uint)bVar3;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      vertices = (stbtt_vertex *)
                 (*(pIVar13->IO).MemAllocFn)(((long)iVar18 + (ulong)uVar5 * 2) * 10 + 10);
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
      local_38 = puVar6 + uVar16 + 10;
      puVar17 = (ushort *)(puVar6 + (ulong)bVar28 * 0x100 + (ulong)bVar27 + uVar22 + uVar16 + 0xc);
      uVar22 = uVar22 & 0xffff;
      lVar19 = (ulong)(CONCAT11(bVar2,bVar3) + 1) * 10;
      bVar27 = 0;
      bVar28 = 0;
      for (lVar26 = 0; lVar19 - lVar26 != 0; lVar26 = lVar26 + 10) {
        if (bVar27 == 0) {
          bVar28 = (byte)*puVar17;
          if ((bVar28 & 8) == 0) {
            puVar17 = (ushort *)((long)puVar17 + 1);
            bVar27 = 0;
          }
          else {
            bVar27 = *(byte *)((long)puVar17 + 1);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          bVar27 = bVar27 - 1;
        }
        (&vertices[uVar22].type)[lVar26] = bVar28;
      }
      sVar30 = 0;
      for (lVar26 = 0; lVar19 - lVar26 != 0; lVar26 = lVar26 + 10) {
        bVar28 = (&vertices[uVar22].type)[lVar26];
        if ((bVar28 & 2) == 0) {
          if ((bVar28 & 0x10) == 0) {
            sVar30 = sVar30 + (*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          uVar12 = *puVar17;
          puVar17 = (ushort *)((long)puVar17 + 1);
          uVar29 = -(ushort)(byte)uVar12;
          if ((bVar28 & 0x10) != 0) {
            uVar29 = (ushort)(byte)uVar12;
          }
          sVar30 = sVar30 + uVar29;
        }
        *(short *)((long)&vertices[uVar22].x + lVar26) = sVar30;
      }
      sVar30 = 0;
      for (lVar26 = 0; lVar19 - lVar26 != 0; lVar26 = lVar26 + 10) {
        bVar28 = (&vertices[uVar22].type)[lVar26];
        if ((bVar28 & 4) == 0) {
          if ((bVar28 & 0x20) == 0) {
            sVar30 = sVar30 + (*puVar17 << 8 | *puVar17 >> 8);
            puVar17 = puVar17 + 1;
          }
        }
        else {
          uVar12 = *puVar17;
          puVar17 = (ushort *)((long)puVar17 + 1);
          uVar29 = -(ushort)(byte)uVar12;
          if ((bVar28 & 0x20) != 0) {
            uVar29 = (ushort)(byte)uVar12;
          }
          sVar30 = sVar30 + uVar29;
        }
        *(short *)((long)&vertices[uVar22].y + lVar26) = sVar30;
      }
      iVar38 = 0;
      uVar14 = 0;
      local_a0 = 0;
      local_a8 = 0;
      uVar16 = 0;
      uVar22 = 0;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_68;
      _local_68 = auVar10 << 0x40;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_78._0_8_;
      local_78 = auVar11 << 0x40;
      iVar35 = 0;
      iVar21 = 0;
      iVar15 = 0;
      num_vertices = 0;
      while( true ) {
        cy = (int)local_a8;
        cx = (int)local_a0;
        if (iVar18 < iVar15) break;
        lVar19 = (long)(int)(iVar15 + (uint)uVar5 * 2);
        bVar28 = vertices[lVar19].type;
        sVar30 = vertices[lVar19].x;
        sVar4 = vertices[lVar19].y;
        uVar23 = (uint)sVar30;
        uVar24 = (ulong)uVar23;
        uVar32 = (uint)sVar4;
        uVar33 = (ulong)uVar32;
        if (iVar35 == iVar15) {
          if (iVar35 != 0) {
            num_vertices = stbtt__close_shape(vertices,num_vertices,iVar38,uVar14,
                                              (stbtt_int32)uVar16,(stbtt_int32)uVar22,local_68._0_4_
                                              ,local_78._0_4_,cx,cy);
          }
          auVar25 = local_68;
          uVar22 = uVar33;
          uVar16 = local_78._0_8_;
          iVar15 = iVar35;
          if ((bVar28 & 1) == 0) {
            auVar25 = (undefined1  [8])uVar24;
            uVar16 = uVar33;
            if ((vertices[lVar19 + 1].type & 1) == 0) {
              uVar24 = (ulong)(uint)((int)((int)vertices[lVar19 + 1].x + uVar23) >> 1);
              uVar22 = (ulong)(uint)((int)((int)vertices[lVar19 + 1].y + uVar32) >> 1);
            }
            else {
              uVar24 = (ulong)(uint)(int)vertices[lVar19 + 1].x;
              uVar22 = (ulong)(uint)(int)vertices[lVar19 + 1].y;
              iVar15 = iVar35 + 1;
            }
          }
          uVar14 = bVar28 & 1 ^ 1;
          vertices[num_vertices].type = '\x01';
          vertices[num_vertices].x = (short)uVar24;
          vertices[num_vertices].y = (short)uVar22;
          vertices[num_vertices].cx = 0;
          vertices[num_vertices].cy = 0;
          iVar35 = (ushort)(*(ushort *)(local_38 + (long)iVar21 * 2) << 8 |
                           *(ushort *)(local_38 + (long)iVar21 * 2) >> 8) + 1;
          iVar21 = iVar21 + 1;
          iVar38 = 0;
          local_68 = auVar25;
          local_78._0_8_ = uVar16;
          uVar16 = uVar24;
          num_vertices = num_vertices + 1;
        }
        else {
          sVar20 = (short)local_a8;
          if ((bVar28 & 1) == 0) {
            local_a8 = uVar33;
            if (iVar38 == 0) {
              iVar38 = 1;
              local_a0 = uVar24;
            }
            else {
              vertices[num_vertices].type = '\x03';
              vertices[num_vertices].x = (short)(cx + uVar23 >> 1);
              vertices[num_vertices].y = (short)(uVar32 + cy >> 1);
              vertices[num_vertices].cx = (short)local_a0;
              vertices[num_vertices].cy = sVar20;
              iVar38 = 1;
              num_vertices = num_vertices + 1;
              local_a0 = uVar24;
            }
          }
          else {
            psVar31 = vertices + num_vertices;
            if (iVar38 == 0) {
              psVar31->type = '\x02';
              psVar31->x = sVar30;
              psVar31->y = sVar4;
              psVar31->cx = 0;
              sVar20 = 0;
            }
            else {
              psVar31->type = '\x03';
              psVar31->x = sVar30;
              psVar31->y = sVar4;
              psVar31->cx = (short)local_a0;
            }
            psVar31->cy = sVar20;
            num_vertices = num_vertices + 1;
            iVar38 = 0;
          }
        }
        iVar15 = iVar15 + 1;
      }
      uVar14 = stbtt__close_shape(vertices,num_vertices,iVar38,uVar14,(stbtt_int32)uVar16,
                                  (stbtt_int32)uVar22,local_68._0_4_,local_78._0_4_,cx,cy);
    }
    *local_40 = vertices;
  }
  return uVar14;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}